

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::IterationLogSectionEmitter::IterationLogSectionEmitter
          (IterationLogSectionEmitter *this,TestLog *log,size_t testIteration,size_t testIterations,
          string *description,bool enabled)

{
  TestLog *this_00;
  ostream *poVar1;
  ulong uVar2;
  string local_240;
  string local_220;
  LogSection local_200;
  ostringstream local_1b0 [8];
  ostringstream buf;
  bool enabled_local;
  string *description_local;
  size_t testIterations_local;
  size_t testIteration_local;
  TestLog *log_local;
  IterationLogSectionEmitter *this_local;
  
  this->m_log = log;
  this->m_enabled = enabled;
  if ((this->m_enabled & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar1 = std::operator<<((ostream *)local_1b0,"Iteration ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,testIteration + 1);
    poVar1 = std::operator<<(poVar1,"/");
    std::ostream::operator<<(poVar1,testIterations);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      poVar1 = std::operator<<((ostream *)local_1b0," - ");
      std::operator<<(poVar1,(string *)description);
    }
    this_00 = this->m_log;
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    tcu::LogSection::LogSection(&local_200,&local_220,&local_240);
    tcu::TestLog::operator<<(this_00,&local_200);
    tcu::LogSection::~LogSection(&local_200);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return;
}

Assistant:

IterationLogSectionEmitter::IterationLogSectionEmitter (tcu::TestLog& log, size_t testIteration, size_t testIterations, const std::string& description, bool enabled)
	: m_log		(log)
	, m_enabled	(enabled)
{
	if (m_enabled)
	{
		std::ostringstream buf;
		buf << "Iteration " << (testIteration+1) << "/" << testIterations;

		if (!description.empty())
			buf << " - " << description;

		m_log << tcu::TestLog::Section(buf.str(), buf.str());
	}
}